

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Cmd::editLine_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Cmd *this,bool mask_mode)

{
  string_view str;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  ssize_t sVar4;
  ulong uVar5;
  char *__a;
  char *__b;
  long lVar6;
  undefined1 local_f0 [8];
  hints_type hc;
  char local_c8;
  char local_c7;
  char local_c6;
  char local_c5;
  int iStack_c4;
  char seq [5];
  int r;
  char ch;
  allocator<char> local_a1;
  string local_a0;
  undefined1 local_70 [8];
  State state;
  bool mask_mode_local;
  Cmd *this_local;
  
  state._79_1_ = mask_mode;
  State::State((State *)local_70);
  state.pos = 0;
  state.buf.field_2._8_8_ = 0;
  iVar3 = getColumns(this);
  state.oldpos = (size_t)iVar3;
  state.cols = 0;
  state.maxrows = 0;
  state.history_index._0_1_ = state._79_1_ & 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"",&local_a1);
  addHistoryEntry(this,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  str = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
  sVar4 = write_string(this,str);
  if (sVar4 == -1) {
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional(__return_storage_ptr__);
  }
  else {
LAB_001082b2:
    do {
      sVar4 = read_char(this,(char *)((long)register0x00000020 + -0xc1) + 4);
      if (sVar4 < 1) {
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  (__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
        goto LAB_00108a5c;
      }
      if ((int)seq[4] == this->complete_key_) {
        iStack_c4 = completeLine(this,(State *)local_70);
        if (seq[4] < '\0') {
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    (__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
          goto LAB_00108a5c;
        }
        if (seq[4] == '\0') goto LAB_001082b2;
        seq[4] = (char)iStack_c4;
      }
      uVar1 = state.buf.field_2._8_8_;
      switch(seq[4]) {
      case '\x01':
        editMoveHome(this,(State *)local_70);
        goto LAB_001082b2;
      case '\x02':
        editMoveLeft(this,(State *)local_70);
        goto LAB_001082b2;
      case '\x03':
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional(__return_storage_ptr__);
        goto LAB_00108a5c;
      case '\x04':
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back(&this->history_);
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::optional(__return_storage_ptr__);
          goto LAB_00108a5c;
        }
        editDelete(this,(State *)local_70);
        goto LAB_001082b2;
      case '\x05':
        editMoveEnd(this,(State *)local_70);
        goto LAB_001082b2;
      case '\x06':
        editMoveRight(this,(State *)local_70);
        goto LAB_001082b2;
      case '\b':
      case '\x7f':
        editBackspace(this,(State *)local_70);
        goto LAB_001082b2;
      case '\n':
      case '\r':
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back(&this->history_);
        if ((this->multiline_mode & 1U) != 0) {
          editMoveEnd(this,(State *)local_70);
        }
        bVar2 = std::function::operator_cast_to_bool((function *)&this->hints_handler_);
        if (bVar2) {
          std::
          function<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>)>
          ::function((function<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>)>
                      *)local_f0,&this->hints_handler_);
          std::
          function<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>)>
          ::operator=(&this->hints_handler_,(nullptr_t)0x0);
          refreshLine(this,(State *)local_70);
          std::
          function<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>)>
          ::operator=(&this->hints_handler_,
                      (function<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>)>
                       *)local_f0);
          std::
          function<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>)>
          ::~function((function<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>)>
                       *)local_f0);
        }
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  (__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
        goto LAB_00108a5c;
      case '\v':
        std::__cxx11::string::erase((ulong)local_70,state.buf.field_2._8_8_);
        refreshLine(this,(State *)local_70);
        goto LAB_001082b2;
      case '\f':
        clearScreen(this);
        refreshLine(this,(State *)local_70);
        goto LAB_001082b2;
      case '\x0e':
        editHistoryNext(this,(State *)local_70,Next);
        goto LAB_001082b2;
      case '\x10':
        editHistoryNext(this,(State *)local_70,Prev);
        goto LAB_001082b2;
      case '\x14':
        if ((state.buf.field_2._8_8_ != 0) &&
           (uVar5 = std::__cxx11::string::size(), (ulong)uVar1 < uVar5)) {
          __a = (char *)std::__cxx11::string::operator[]((ulong)local_70);
          __b = (char *)std::__cxx11::string::operator[]((ulong)local_70);
          std::swap<char>(__a,__b);
          uVar1 = state.buf.field_2._8_8_;
          lVar6 = std::__cxx11::string::size();
          if (uVar1 != lVar6 + -1) {
            state.buf.field_2._8_8_ = state.buf.field_2._8_8_ + 1;
          }
          refreshLine(this,(State *)local_70);
        }
        goto LAB_001082b2;
      case '\x15':
        std::__cxx11::string::clear();
        state.buf.field_2._8_8_ = 0;
        refreshLine(this,(State *)local_70);
        goto LAB_001082b2;
      case '\x17':
        editDeletePreviousWord(this,(State *)local_70);
        goto LAB_001082b2;
      case '\x1a':
        disableRawMode(this,this->in_fd_);
        raise(0x14);
        enableRawMode(this,this->in_fd_);
        refreshLine(this,(State *)local_70);
        goto LAB_001082b2;
      case '\x1b':
        sVar4 = read_char(this,(char *)((long)&hc._M_invoker + 7));
        if ((sVar4 != -1) && (sVar4 = read_char(this,&local_c8), sVar4 != -1)) {
          if (hc._M_invoker._7_1_ == '[') {
            iVar3 = isdigit((int)local_c8);
            if (iVar3 == 0) {
              switch(local_c8) {
              case 'A':
                editHistoryNext(this,(State *)local_70,Prev);
                break;
              case 'B':
                editHistoryNext(this,(State *)local_70,Next);
                break;
              case 'C':
                editMoveRight(this,(State *)local_70);
                break;
              case 'D':
                editMoveLeft(this,(State *)local_70);
                break;
              case 'F':
                editMoveEnd(this,(State *)local_70);
                break;
              case 'H':
                editMoveHome(this,(State *)local_70);
              }
            }
            else {
              sVar4 = read_char(this,&local_c7);
              if (sVar4 != -1) {
                if (local_c7 == ';') {
                  sVar4 = read_char(this,&local_c6);
                  if ((sVar4 != -1) && (sVar4 = read_char(this,&local_c5), sVar4 != -1)) {
                    if ((local_c6 == '5') && (local_c5 == 'D')) {
                      editMovePrevWord(this,(State *)local_70);
                    }
                    else if ((local_c6 == '5') && (local_c5 == 'C')) {
                      editMoveNextWord(this,(State *)local_70);
                    }
                  }
                }
                else if ((local_c7 == '~') && (local_c8 == '3')) {
                  editDelete(this,(State *)local_70);
                }
              }
            }
          }
          else if (hc._M_invoker._7_1_ == 'O') {
            if (local_c8 == 'F') {
              editMoveEnd(this,(State *)local_70);
            }
            else if (local_c8 == 'H') {
              editMoveHome(this,(State *)local_70);
            }
          }
        }
        goto LAB_001082b2;
      }
      iVar3 = editInsert(this,(State *)local_70,seq[4]);
    } while (iVar3 == 0);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional(__return_storage_ptr__);
  }
LAB_00108a5c:
  State::~State((State *)local_70);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> editLine(bool mask_mode) {
		State state;

		// Populate the state that we pass to functions implementing specific editing functionalities.
		state.oldpos        = 0;
		state.pos           = 0;
		state.cols          = getColumns();
		state.maxrows       = 0;
		state.history_index = 0;
		state.mask_mode     = mask_mode;

		// The latest history entry is always our current buffer, that initially is just an empty string.
		addHistoryEntry("");

		if (write_string(prompt) == -1) {
			return {};
		}

		while (true) {

			char ch;
			if (read_char(&ch) <= 0) {
				return state.buf;
			}

			// Only autocomplete when the callback is set.
			if (ch == complete_key_) {
				int r = completeLine(&state);
				// Return on errors
				if (ch < 0)
					return state.buf;

				// Read next character when 0
				if (ch == '\0')
					continue;

				ch = r;
			}

			char seq[5];
			switch (ch) {
			case LINE_FEED:
			case ENTER: // enter
				history_.pop_back();

				if (multiline_mode) {
					editMoveEnd(&state);
				}

				if (hints_handler_) {
					// Force a refresh without hints to leave the previous line as the user typed it after a newline.
					hints_type hc  = hints_handler_;
					hints_handler_ = nullptr;
					refreshLine(&state);
					hints_handler_ = hc;
				}
				return state.buf;
			case CTRL_C: // ctrl-c
				return {};
			case CTRL_Z: // ctrl-z
#ifdef SIGTSTP
				// send ourselves SIGSUSP
				disableRawMode(in_fd_);
				raise(SIGTSTP);
				// and resume
				enableRawMode(in_fd_);
				refreshLine(&state);
#endif
				continue;
			case BACKSPACE: // backspace
			case CTRL_H:    // ctrl-h
				editBackspace(&state);
				break;
			case CTRL_D: // ctrl-d, remove char at right of cursor, or if the line is empty, act as end-of-file.
				if (!state.buf.empty()) {
					editDelete(&state);
				} else {
					history_.pop_back();
					return {};
				}
				break;
			case CTRL_T: // ctrl-t, swaps current character with previous.
				if (state.pos > 0 && state.pos < state.buf.size()) {
					std::swap(state.buf[state.pos], state.buf[state.pos - 1]);

					if (state.pos != state.buf.size() - 1) {
						state.pos++;
					}
					refreshLine(&state);
				}
				break;
			case CTRL_B: // ctrl-b
				editMoveLeft(&state);
				break;
			case CTRL_F: // ctrl-f
				editMoveRight(&state);
				break;
			case CTRL_P: // ctrl-p
				editHistoryNext(&state, Direction::Prev);
				break;
			case CTRL_N: // ctrl-n
				editHistoryNext(&state, Direction::Next);
				break;
			case ESC: // escape sequence
				// Read the next two bytes representing the escape sequence.
				// Use two calls to handle slow terminals returning the two chars at different times.
				if (read_char(&seq[0]) == -1) {
					break;
				}

				if (read_char(&seq[1]) == -1) {
					break;
				}

				// ESC [ sequences.
				if (seq[0] == '[') {
					if (isdigit(seq[1])) {

						// Extended escape, read additional byte.
						if (read_char(&seq[2]) == -1) {
							break;
						}

						switch (seq[2]) {
						case '~':
							switch (seq[1]) {
							case '3': // Delete key.
								editDelete(&state);
								break;
							}
							break;
						case ';':
							// Read the next two bytes representing the escape sequence.
							// Use two calls to handle slow terminals returning the two chars at different times.
							if (read_char(&seq[3]) == -1) {
								break;
							}

							if (read_char(&seq[4]) == -1) {
								break;
							}

							if (seq[3] == '5' && seq[4] == 'D') {
								editMovePrevWord(&state);
							} else if (seq[3] == '5' && seq[4] == 'C') {
								editMoveNextWord(&state);
							}
							break;
						}
					} else {
						switch (seq[1]) {
						case 'A': // Up
							editHistoryNext(&state, Direction::Prev);
							break;
						case 'B': // Down
							editHistoryNext(&state, Direction::Next);
							break;
						case 'C': // Right
							editMoveRight(&state);
							break;
						case 'D': // Left
							editMoveLeft(&state);
							break;
						case 'H': // Home
							editMoveHome(&state);
							break;
						case 'F': // End
							editMoveEnd(&state);
							break;
						}
					}
				}

				// ESC O sequences.
				else if (seq[0] == 'O') {
					switch (seq[1]) {
					case 'H': // Home
						editMoveHome(&state);
						break;
					case 'F': // End
						editMoveEnd(&state);
						break;
					}
				}
				break;
			default:
				if (editInsert(&state, ch)) {
					return {};
				}
				break;
			case CTRL_U: // Ctrl+u, delete the whole line.
				state.buf.clear();
				state.pos = 0;
				refreshLine(&state);
				break;
			case CTRL_K: // Ctrl+k, delete from current to end of line.
				state.buf.erase(state.pos);
				refreshLine(&state);
				break;
			case CTRL_A: // Ctrl+a, go to the start of the line
				editMoveHome(&state);
				break;
			case CTRL_E: // ctrl+e, go to the end of the line
				editMoveEnd(&state);
				break;
			case CTRL_L: // ctrl+l, clear screen
				clearScreen();
				refreshLine(&state);
				break;
			case CTRL_W: // ctrl+w, delete previous word
				editDeletePreviousWord(&state);
				break;
			}
		}
		return state.buf;
	}